

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void pop_scope(JSParseState *s)

{
  int iVar1;
  uint uVar2;
  JSFunctionDef *pJVar3;
  JSVarScope *pJVar4;
  uint uVar5;
  uint uVar6;
  ulong extraout_RDX;
  ulong uVar7;
  JSFunctionDef *fd;
  undefined2 local_1a;
  
  pJVar3 = s->cur_func;
  if (pJVar3 != (JSFunctionDef *)0x0) {
    iVar1 = pJVar3->scope_level;
    emit_op(s,0xb3);
    local_1a = (undefined2)iVar1;
    dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_1a,2);
    pJVar4 = pJVar3->scopes;
    uVar5 = pJVar4[iVar1].parent;
    pJVar3->scope_level = uVar5;
    uVar7 = extraout_RDX;
    do {
      if ((int)uVar5 < 0) {
        uVar6 = 0xffffffff;
        break;
      }
      uVar2 = pJVar4[uVar5].first;
      uVar6 = uVar2;
      if ((int)uVar2 < 0) {
        uVar5 = pJVar4[uVar5].parent;
        uVar6 = (uint)uVar7;
      }
      uVar7 = (ulong)uVar6;
    } while ((int)uVar2 < 0);
    pJVar3->scope_first = uVar6;
  }
  return;
}

Assistant:

static void pop_scope(JSParseState *s) {
    if (s->cur_func) {
        /* disable scoped variables */
        JSFunctionDef *fd = s->cur_func;
        int scope = fd->scope_level;
        emit_op(s, OP_leave_scope);
        emit_u16(s, scope);
        fd->scope_level = fd->scopes[scope].parent;
        fd->scope_first = get_first_lexical_var(fd, fd->scope_level);
    }
}